

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O0

void Aig_MmFixedStop(Aig_MmFixed_t *p,int fVerbose)

{
  int local_18;
  int i;
  int fVerbose_local;
  Aig_MmFixed_t *p_local;
  
  if (p != (Aig_MmFixed_t *)0x0) {
    if (fVerbose != 0) {
      printf("Fixed memory manager: Entry = %5d. Chunk = %5d. Chunks used = %5d.\n",
             (ulong)(uint)p->nEntrySize,(ulong)(uint)p->nChunkSize,(ulong)(uint)p->nChunks);
      printf("   Entries used = %8d. Entries peak = %8d. Memory used = %8d. Memory alloc = %8d.\n",
             (ulong)(uint)p->nEntriesUsed,(ulong)(uint)p->nEntriesMax,
             (ulong)(uint)(p->nEntrySize * p->nEntriesUsed),(ulong)(uint)p->nMemoryAlloc);
    }
    for (local_18 = 0; local_18 < p->nChunks; local_18 = local_18 + 1) {
      if (p->pChunks[local_18] != (char *)0x0) {
        free(p->pChunks[local_18]);
        p->pChunks[local_18] = (char *)0x0;
      }
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
      p->pChunks = (char **)0x0;
    }
    if (p != (Aig_MmFixed_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Aig_MmFixedStop( Aig_MmFixed_t * p, int fVerbose )
{
    int i;
    if ( p == NULL )
        return;
    if ( fVerbose )
    {
        printf( "Fixed memory manager: Entry = %5d. Chunk = %5d. Chunks used = %5d.\n",
            p->nEntrySize, p->nChunkSize, p->nChunks );
        printf( "   Entries used = %8d. Entries peak = %8d. Memory used = %8d. Memory alloc = %8d.\n",
            p->nEntriesUsed, p->nEntriesMax, p->nEntrySize * p->nEntriesUsed, p->nMemoryAlloc );
    }
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}